

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O2

KFLOAT64 * __thiscall
KDIS::DATA_TYPE::WorldCoordinates::operator[](WorldCoordinates *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (i < 3) {
    return &this->m_f64X + (i & 0x1fff);
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"operator[]",&local_39);
  KException::KException(this_00,&local_38,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

KFLOAT64 &WorldCoordinates::operator[](KUINT16 i) noexcept(false)
{
    switch( i )
    {
        case 0:		return m_f64X;
        case 1:     return m_f64Y;
        case 2:     return m_f64Z;
        default:    throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}